

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_utils.cc
# Opt level: O2

bool draco::parser::ParseUnsignedInt(DecoderBuffer *buffer,uint32_t *value)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  uint32_t uVar4;
  
  uVar4 = 0;
  bVar2 = false;
  lVar1 = buffer->pos_;
  while ((lVar3 = lVar1 + 1, lVar3 <= buffer->data_size_ &&
         ((byte)(buffer->data_[lVar1] - 0x30U) < 10))) {
    uVar4 = (uVar4 * 10 + (uint)(byte)buffer->data_[lVar1]) - 0x30;
    buffer->pos_ = lVar3;
    bVar2 = true;
    lVar1 = lVar3;
  }
  if (bVar2) {
    *value = uVar4;
  }
  return bVar2;
}

Assistant:

bool ParseUnsignedInt(DecoderBuffer *buffer, uint32_t *value) {
  // Parse the number until we run out of digits.
  uint32_t v = 0;
  char ch;
  bool have_digits = false;
  while (buffer->Peek(&ch) && ch >= '0' && ch <= '9') {
    v *= 10;
    v += (ch - '0');
    buffer->Advance(1);
    have_digits = true;
  }
  if (!have_digits) {
    return false;
  }
  *value = v;
  return true;
}